

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

OPJ_BOOL opj_t1_encode_cblks(opj_t1_t *t1,opj_tcd_tile_t *tile,opj_tcp_t *tcp,OPJ_FLOAT64 *mct_norms
                            ,OPJ_UINT32 mct_numcomps)

{
  int *piVar1;
  opj_flag_t oVar2;
  opj_tcd_tilecomp_t *poVar3;
  opj_tcd_cblk_enc_t *poVar4;
  OPJ_INT32 *pOVar5;
  OPJ_INT32 OVar6;
  opj_tcd_tile_t *poVar7;
  OPJ_BOOL OVar8;
  opj_flag_t *poVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  OPJ_INT32 one;
  int iVar14;
  opj_tcd_resolution_t *poVar15;
  long lVar16;
  int iVar17;
  OPJ_UINT32 OVar18;
  opj_tcd_tilecomp_t *poVar19;
  uint uVar20;
  OPJ_UINT32 OVar21;
  OPJ_UINT32 OVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  opj_mqc_t *mqc;
  uint uVar28;
  uint uVar29;
  opj_tcd_band_t *band;
  ulong uVar30;
  uint uVar31;
  opj_tcd_pass_t *poVar32;
  float fVar33;
  double dVar34;
  OPJ_BYTE OVar35;
  OPJ_INT32 local_168;
  int local_164;
  uint local_160;
  char local_15a;
  byte local_159;
  double local_158;
  uint local_14c;
  OPJ_UINT32 local_148;
  uint local_144;
  opj_tcd_cblk_enc_t *local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  uint local_11c;
  opj_tcd_tilecomp_t *local_118;
  ulong local_110;
  OPJ_UINT32 local_104;
  opj_tcd_band_t *local_100;
  ulong local_f8;
  uint local_f0;
  OPJ_UINT32 local_ec;
  long local_e8;
  ulong local_e0;
  opj_tccp_t *local_d8;
  OPJ_FLOAT64 *local_d0;
  opj_tcd_tile_t *local_c8;
  double local_c0;
  opj_tcd_pass_t *local_b8;
  ulong local_b0;
  opj_mqc_state_t **local_a8;
  ulong local_a0;
  ulong local_98;
  opj_tcp_t *local_90;
  ulong local_88;
  opj_tcd_band_t *local_80;
  ulong local_78;
  ulong local_70;
  opj_tcd_resolution_t *local_68;
  opj_tcd_precinct_t *local_60;
  ulong local_58;
  ulong local_50;
  double local_48;
  long local_40;
  opj_mqc_state_t **local_38;
  
  tile->distotile = 0.0;
  local_a8 = (t1->mqc).ctxs + 0x11;
  local_38 = (t1->mqc).ctxs + 0x12;
  local_98 = (ulong)mct_numcomps;
  local_110 = 0;
  local_d0 = mct_norms;
  local_c8 = tile;
  local_90 = tcp;
  do {
    if (tile->numcomps <= local_110) {
      return 1;
    }
    poVar3 = tile->comps;
    poVar19 = poVar3 + local_110;
    local_d8 = local_90->tccps + local_110;
    local_70 = (ulong)(uint)(poVar3[local_110].x1 - poVar3[local_110].x0);
    local_15a = local_110 < local_98 && local_d0 != (OPJ_FLOAT64 *)0x0;
    local_e8 = local_70 * 4;
    local_118 = poVar19;
    for (local_88 = 0; local_88 < poVar19->numresolutions; local_88 = local_88 + 1) {
      poVar15 = poVar19->resolutions + local_88;
      local_80 = poVar19->resolutions[local_88].bands;
      local_e0 = (ulong)((uint)local_88 - 1);
      local_f0 = ~(uint)local_88;
      for (local_78 = 0; local_78 < poVar15->numbands; local_78 = local_78 + 1) {
        band = local_80 + local_78;
        OVar8 = opj_tcd_is_band_empty(band);
        poVar19 = local_118;
        if (OVar8 == 0) {
          local_100 = band;
          fVar33 = floorf((float)band->stepsize * 8192.0);
          local_40 = (long)(int)(0x4000000 / (long)(int)fVar33);
          uVar11 = 0;
          poVar19 = local_118;
          local_68 = poVar15;
          while (uVar11 < poVar15->ph * poVar15->pw) {
            local_60 = local_100->precincts + uVar11;
            uVar30 = 0;
            local_58 = uVar11;
            while (uVar30 < local_60->ch * local_60->cw) {
              poVar4 = (local_60->cblks).enc;
              iVar14 = poVar4[uVar30].x0 - local_100->x0;
              if ((local_100->bandno & 1) != 0) {
                iVar14 = (iVar14 + poVar19->resolutions[local_e0].x1) -
                         poVar19->resolutions[local_e0].x0;
              }
              iVar17 = poVar4[uVar30].y0 - local_100->y0;
              if ((local_100->bandno & 2) != 0) {
                iVar17 = (iVar17 + local_118->resolutions[local_e0].y1) -
                         local_118->resolutions[local_e0].y0;
              }
              local_140 = poVar4 + uVar30;
              local_50 = uVar30;
              OVar8 = opj_t1_allocate_buffers
                                (t1,local_140->x1 - poVar4[uVar30].x0,
                                 local_140->y1 - poVar4[uVar30].y0);
              poVar4 = local_140;
              if (OVar8 == 0) {
                return 0;
              }
              OVar18 = t1->w;
              OVar22 = t1->h;
              uVar11 = (ulong)((OPJ_UINT32)local_70 - OVar18);
              pOVar5 = local_118->data;
              lVar23 = (long)iVar17;
              lVar24 = (long)iVar14;
              t1->data = pOVar5 + lVar23 * local_70 + lVar24;
              t1->data_stride = (OPJ_UINT32)local_70;
              if (local_d8->qmfbid == 1) {
                lVar25 = 0;
                for (OVar21 = 0; OVar21 != OVar22; OVar21 = OVar21 + 1) {
                  for (lVar26 = 0; OVar18 != (OPJ_UINT32)lVar26; lVar26 = lVar26 + 1) {
                    piVar1 = (int *)((long)pOVar5 +
                                    lVar26 * 4 + lVar25 * 4 + lVar23 * local_e8 + lVar24 * 4);
                    *piVar1 = *piVar1 << 6;
                  }
                  lVar25 = lVar25 + uVar11 + lVar26;
                }
              }
              else {
                lVar25 = 0;
                for (OVar21 = 0; OVar21 != OVar22; OVar21 = OVar21 + 1) {
                  lVar26 = lVar25 * 4 + lVar23 * local_e8 + lVar24 * 4;
                  for (lVar27 = 0; OVar18 != (OPJ_UINT32)lVar27; lVar27 = lVar27 + 1) {
                    lVar16 = *(int *)((long)pOVar5 + lVar27 * 4 + lVar26) * local_40 + 0x1000 >>
                             0x12;
                    if (0x7fffffff < lVar16) {
                      __assert_fail("(temp >> (13 + 11 - T1_NMSEDEC_FRACBITS)) <= (OPJ_INT64)0x7FFFFFFF"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                                    ,0x107,"OPJ_INT32 opj_int_fix_mul_t1(OPJ_INT32, OPJ_INT32)");
                    }
                    if (lVar16 < -0x80000000) {
                      __assert_fail("(temp >> (13 + 11 - T1_NMSEDEC_FRACBITS)) >= (-(OPJ_INT64)0x7FFFFFFF - (OPJ_INT64)1)"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                                    ,0x109,"OPJ_INT32 opj_int_fix_mul_t1(OPJ_INT32, OPJ_INT32)");
                    }
                    *(int *)((long)pOVar5 + lVar27 * 4 + lVar26) = (int)lVar16;
                  }
                  lVar25 = lVar25 + uVar11 + lVar27;
                }
              }
              local_104 = local_100->bandno;
              local_148 = local_118->numresolutions;
              local_130 = (ulong)local_d8->cblksty;
              local_ec = local_d8->qmfbid;
              fVar33 = (float)local_100->stepsize;
              (t1->mqc).lut_ctxno_zc_orient = "" + (local_104 << 9);
              uVar10 = 0;
              for (OVar18 = 0; OVar18 != t1->w; OVar18 = OVar18 + 1) {
                for (OVar22 = 0; t1->h != OVar22; OVar22 = OVar22 + 1) {
                  uVar29 = (pOVar5 + lVar23 * local_70 + lVar24)[t1->data_stride * OVar22 + OVar18];
                  uVar28 = -uVar29;
                  if (0 < (int)uVar29) {
                    uVar28 = uVar29;
                  }
                  if ((int)uVar10 <= (int)uVar28) {
                    uVar10 = uVar28;
                  }
                }
              }
              if (uVar10 == 0) {
                local_140->numbps = 0;
LAB_0012560d:
                local_140->totalpasses = 0;
              }
              else {
                local_148 = local_148 + local_f0;
                local_48 = (double)fVar33;
                iVar14 = 0;
                for (; 1 < (int)uVar10; uVar10 = uVar10 >> 1) {
                  iVar14 = iVar14 + -1;
                }
                local_140->numbps = -(iVar14 + 5);
                if (iVar14 == -5) goto LAB_0012560d;
                opj_mqc_resetstates(&t1->mqc);
                opj_mqc_setstate(&t1->mqc,0x12,0,0x2e);
                opj_mqc_setstate(&t1->mqc,0x11,0,3);
                opj_mqc_setstate(&t1->mqc,0,0,4);
                uVar11 = 0;
                opj_mqc_init_enc(&t1->mqc,poVar4->data);
                local_159 = (byte)local_130 & 1;
                local_a0 = (ulong)((uint)local_130 & 8);
                local_11c = (uint)local_130 & 0x10;
                local_c0 = 0.0;
                uVar10 = 2;
                for (iVar14 = -6 - iVar14; OVar18 = (OPJ_UINT32)uVar11, -1 < iVar14;
                    iVar14 = iVar14 - (uint)(uVar29 == 3)) {
                  local_b8 = local_140->passes;
                  local_144 = (uint)local_159;
                  if ((int)(local_140->numbps - 4) <= iVar14) {
                    local_144 = 0;
                  }
                  if (1 < uVar10) {
                    local_144 = 0;
                  }
                  local_14c = uVar10;
                  if ((OVar18 != 0) && ((local_b8[OVar18 - 1].field_0x14 & 1) != 0)) {
                    if ((byte)local_144 == '\0') {
                      opj_mqc_restart_init_enc(&t1->mqc);
                    }
                    else {
                      opj_mqc_bypass_init_enc(&t1->mqc);
                    }
                  }
                  uVar10 = 0x40 << ((byte)iVar14 & 0x1f);
                  local_b0 = uVar11;
                  if (local_14c == 2) {
                    local_168 = 0;
                    uVar11 = 0;
                    iVar17 = 1;
                    dVar34 = 0.0;
                    while ((ulong)dVar34 < (ulong)(t1->h & 0xfffffffc)) {
                      local_128 = (ulong)((int)((ulong)dVar34 >> 2) + 1);
                      uVar29 = 0;
                      local_164 = iVar17;
                      local_158 = dVar34;
                      local_138 = uVar11;
                      while (uVar29 < t1->w) {
                        poVar9 = t1->flags;
                        uVar28 = uVar29 + 1;
                        uVar11 = (ulong)((t1->w + 2) * (int)local_128 + uVar29 + 1);
                        uVar30 = 0;
                        oVar2 = poVar9[uVar11];
                        if (oVar2 == 0) {
                          uVar12 = SUB84(local_158,0) * t1->data_stride + uVar29;
                          for (uVar30 = 0; uVar30 != 4; uVar30 = uVar30 + 1) {
                            uVar31 = t1->data[uVar12];
                            uVar20 = -uVar31;
                            if (0 < (int)uVar31) {
                              uVar20 = uVar31;
                            }
                            if ((uVar20 & uVar10) != 0) {
                              (t1->mqc).curctx = local_a8;
                              local_160 = uVar28;
                              opj_mqc_encode(&t1->mqc,1);
                              (t1->mqc).curctx = local_38;
                              opj_mqc_encode(&t1->mqc,(uint)(uVar30 >> 1) & 0x7fffffff);
                              opj_mqc_encode(&t1->mqc,(uint)uVar30 & 1);
                              poVar9 = t1->flags;
                              uVar11 = (ulong)((t1->w + 2) * (int)local_128 + local_160);
                              uVar28 = local_160;
                              goto LAB_001250fb;
                            }
                            uVar12 = uVar12 + t1->data_stride;
                          }
                          (t1->mqc).curctx = local_a8;
                          opj_mqc_encode(&t1->mqc,0);
                          uVar29 = uVar28;
                        }
                        else {
LAB_001250fb:
                          opj_t1_enc_clnpass_step
                                    (t1,poVar9 + uVar11,
                                     t1->data +
                                     ((SUB84(local_158,0) + (OPJ_UINT32)uVar30) * t1->data_stride +
                                     uVar29),iVar14,uVar10,&local_168,(uint)(oVar2 == 0),
                                     (OPJ_UINT32)uVar30,4,(OPJ_UINT32)local_130);
                          uVar29 = uVar28;
                        }
                      }
                      uVar11 = (ulong)((int)local_138 + 4);
                      iVar17 = local_164 + 1;
                      dVar34 = (double)((long)local_158 + 4);
                    }
                    if (SUB84(dVar34,0) < t1->h) {
                      for (uVar29 = 0; uVar29 < t1->w; uVar29 = uVar29 + 1) {
                        opj_t1_enc_clnpass_step
                                  (t1,t1->flags + (uVar29 + (t1->w + 2) * iVar17 + 1),
                                   t1->data + (t1->data_stride * (int)uVar11 + uVar29),iVar14,uVar10
                                   ,&local_168,0,0,t1->h - SUB84(dVar34,0),(OPJ_UINT32)local_130);
                      }
                    }
                    if ((local_130 & 0x20) != 0) {
                      opj_mqc_segmark_enc(&t1->mqc);
                    }
                  }
                  else {
                    local_128 = (ulong)(byte)local_144;
                    local_158 = (double)CONCAT44(local_158._4_4_,uVar10);
                    if (local_14c == 1) {
                      uVar29 = t1->w;
                      poVar9 = t1->flags + (uVar29 + 3);
                      local_168 = 0;
                      uVar11 = 0;
                      local_160 = 1;
                      local_138 = CONCAT44(local_138._4_4_,2);
                      local_164 = 3;
                      while( true ) {
                        uVar28 = t1->h;
                        uVar12 = (uint)uVar11;
                        if ((uVar28 & 0xfffffffc) <= uVar12) break;
                        local_f8 = uVar11;
                        for (uVar28 = 0; uVar28 < uVar29; uVar28 = uVar28 + 1) {
                          if ((~*poVar9 & 0x49200000) != 0 && (*poVar9 & 0x2490) != 0) {
                            OVar35 = (OPJ_BYTE)local_128;
                            opj_t1_enc_refpass_step
                                      (t1,poVar9,t1->data + (t1->data_stride * (int)uVar11 + uVar28)
                                       ,iVar14,uVar10,&local_168,OVar35,0);
                            opj_t1_enc_refpass_step
                                      (t1,poVar9,t1->data + (t1->data_stride * local_160 + uVar28),
                                       iVar14,local_158._0_4_,&local_168,OVar35,1);
                            opj_t1_enc_refpass_step
                                      (t1,poVar9,
                                       t1->data + (t1->data_stride * (int)local_138 + uVar28),iVar14
                                       ,local_158._0_4_,&local_168,OVar35,2);
                            uVar11 = local_f8;
                            uVar10 = local_158._0_4_;
                            opj_t1_enc_refpass_step
                                      (t1,poVar9,t1->data + (t1->data_stride * local_164 + uVar28),
                                       iVar14,local_158._0_4_,&local_168,OVar35,3);
                            uVar29 = t1->w;
                          }
                          poVar9 = poVar9 + 1;
                        }
                        poVar9 = poVar9 + 2;
                        uVar11 = (ulong)((int)uVar11 + 4);
                        local_164 = local_164 + 4;
                        local_138 = CONCAT44(local_138._4_4_,(int)local_138 + 4);
                        local_160 = local_160 + 4;
                      }
                      if (uVar12 < uVar28) {
                        for (uVar31 = 0; uVar31 < uVar29; uVar31 = uVar31 + 1) {
                          if ((*poVar9 & 0x2490) != 0) {
                            for (OVar18 = 0; uVar12 + OVar18 < uVar28; OVar18 = OVar18 + 1) {
                              opj_t1_enc_refpass_step
                                        (t1,poVar9,
                                         t1->data + ((uVar12 + OVar18) * t1->data_stride + uVar31),
                                         iVar14,uVar10,&local_168,(OPJ_BYTE)local_128,OVar18);
                              uVar28 = t1->h;
                            }
                            uVar29 = t1->w;
                          }
                          poVar9 = poVar9 + 1;
                        }
                      }
                    }
                    else {
                      uVar29 = t1->w;
                      poVar9 = t1->flags + (uVar29 + 3);
                      local_168 = 0;
                      uVar11 = 0;
                      local_160 = 1;
                      local_138 = CONCAT44(local_138._4_4_,2);
                      local_164 = 3;
                      while( true ) {
                        uVar28 = t1->h;
                        uVar12 = (uint)uVar11;
                        if ((uVar28 & 0xfffffffc) <= uVar12) break;
                        local_f8 = uVar11;
                        for (uVar28 = 0; uVar28 < uVar29; uVar28 = uVar28 + 1) {
                          if (*poVar9 != 0) {
                            OVar35 = (OPJ_BYTE)local_128;
                            opj_t1_enc_sigpass_step
                                      (t1,poVar9,t1->data + (t1->data_stride * (int)uVar11 + uVar28)
                                       ,iVar14,uVar10,&local_168,OVar35,0,(OPJ_UINT32)local_a0);
                            opj_t1_enc_sigpass_step
                                      (t1,poVar9,t1->data + (t1->data_stride * local_160 + uVar28),
                                       iVar14,local_158._0_4_,&local_168,OVar35,1,0);
                            opj_t1_enc_sigpass_step
                                      (t1,poVar9,
                                       t1->data + (t1->data_stride * (int)local_138 + uVar28),iVar14
                                       ,local_158._0_4_,&local_168,OVar35,2,0);
                            uVar11 = local_f8;
                            uVar10 = local_158._0_4_;
                            opj_t1_enc_sigpass_step
                                      (t1,poVar9,t1->data + (t1->data_stride * local_164 + uVar28),
                                       iVar14,local_158._0_4_,&local_168,OVar35,3,0);
                            uVar29 = t1->w;
                          }
                          poVar9 = poVar9 + 1;
                        }
                        poVar9 = poVar9 + 2;
                        uVar11 = (ulong)((int)uVar11 + 4);
                        local_164 = local_164 + 4;
                        local_138 = CONCAT44(local_138._4_4_,(int)local_138 + 4);
                        local_160 = local_160 + 4;
                      }
                      if (uVar12 < uVar28) {
                        for (uVar31 = 0; uVar31 < uVar29; uVar31 = uVar31 + 1) {
                          if (*poVar9 != 0) {
                            for (OVar18 = 0; uVar12 + OVar18 < uVar28; OVar18 = OVar18 + 1) {
                              opj_t1_enc_sigpass_step
                                        (t1,poVar9,
                                         t1->data + ((uVar12 + OVar18) * t1->data_stride + uVar31),
                                         iVar14,uVar10,&local_168,(OPJ_BYTE)local_128,OVar18,
                                         (uint)(OVar18 == 0 && (int)local_a0 != 0));
                              uVar28 = t1->h;
                            }
                            uVar29 = t1->w;
                          }
                          poVar9 = poVar9 + 1;
                        }
                      }
                    }
                  }
                  poVar7 = local_c8;
                  OVar6 = local_168;
                  local_158 = 1.0;
                  if (local_15a != '\0') {
                    local_158 = (double)local_d0[local_110];
                  }
                  if (local_ec == 1) {
                    dVar34 = (double)opj_dwt_getnorm(local_148,local_104);
                  }
                  else {
                    dVar34 = (double)opj_dwt_getnorm_real(local_148,local_104);
                  }
                  poVar32 = local_b8 + (local_b0 & 0xffffffff);
                  dVar34 = (double)(1 << ((byte)iVar14 & 0x1f)) * local_158 * dVar34 * local_48;
                  dVar34 = (double)OVar6 * dVar34 * 0.0001220703125 * dVar34;
                  local_c0 = local_c0 + dVar34;
                  poVar7->distotile = (OPJ_FLOAT64)(dVar34 + (double)poVar7->distotile);
                  poVar32->distortiondec = (OPJ_FLOAT64)local_c0;
                  if ((((local_130 & 4) == 0) && (local_14c != 2 || iVar14 != 0)) &&
                     (((local_130 & 1) == 0 ||
                      (((iVar17 = local_140->numbps - 4, local_14c != 2 || (iVar17 != iVar14)) &&
                       ((local_14c == 0 || (iVar17 <= iVar14)))))))) {
                    OVar22 = 3;
                    if ((byte)local_144 != '\0') {
                      OVar22 = opj_mqc_bypass_get_extra_bytes(&t1->mqc,local_11c);
                    }
                    poVar32->field_0x14 = poVar32->field_0x14 & 0xfe;
                    OVar18 = opj_mqc_numbytes(&t1->mqc);
                    OVar18 = OVar18 + OVar22;
                  }
                  else {
                    if ((byte)local_144 == '\0') {
                      if (local_11c == 0) {
                        opj_mqc_flush(&t1->mqc);
                      }
                      else {
                        opj_mqc_erterm_enc(&t1->mqc);
                      }
                    }
                    else {
                      opj_mqc_bypass_flush_enc(&t1->mqc,local_11c);
                    }
                    poVar32->field_0x14 = poVar32->field_0x14 | 1;
                    OVar18 = opj_mqc_numbytes(&t1->mqc);
                  }
                  uVar29 = local_14c + 1;
                  uVar10 = uVar29;
                  if (uVar29 == 3) {
                    uVar10 = 0;
                  }
                  poVar32->rate = OVar18;
                  if ((local_130 & 2) != 0) {
                    opj_mqc_reset_enc(&t1->mqc);
                  }
                  uVar11 = (ulong)((int)local_b0 + 1);
                }
                local_140->totalpasses = OVar18;
                uVar30 = 0;
                uVar11 = 0;
                if (OVar18 != 0) {
                  OVar18 = opj_mqc_numbytes(&t1->mqc);
                  uVar11 = (ulong)local_140->totalpasses;
                  uVar13 = uVar11;
                  do {
                    lVar23 = -uVar13;
                    lVar24 = uVar13 * 0x18;
                    while( true ) {
                      lVar23 = lVar23 + 1;
                      if (lVar23 == 1) goto LAB_001256c2;
                      uVar10 = *(uint *)((long)&local_140->passes[-1].rate + lVar24);
                      if (uVar10 <= OVar18) break;
                      *(OPJ_UINT32 *)((long)&local_140->passes[-1].rate + lVar24) = OVar18;
                      lVar24 = lVar24 + -0x18;
                    }
                    uVar13 = -lVar23;
                    OVar18 = uVar10;
                  } while( true );
                }
LAB_001256c2:
                while (iVar14 = (int)uVar30, (int)uVar11 != iVar14) {
                  poVar32 = local_140->passes;
                  uVar10 = poVar32[uVar30].rate;
                  if (uVar10 == 0) {
                    __assert_fail("pass->rate > 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/t1.c"
                                  ,0x966,
                                  "void opj_t1_encode_cblk(opj_t1_t *, opj_tcd_cblk_enc_t *, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_FLOAT64, OPJ_UINT32, OPJ_UINT32, opj_tcd_tile_t *, const OPJ_FLOAT64 *, OPJ_UINT32)"
                                 );
                  }
                  uVar29 = uVar10 - 1;
                  if (local_140->data[uVar29] == 0xff) {
                    poVar32[uVar30].rate = uVar29;
                    uVar10 = uVar29;
                  }
                  if (iVar14 == 0) {
                    OVar18 = 0;
                  }
                  else {
                    OVar18 = poVar32[iVar14 - 1].rate;
                  }
                  poVar32[uVar30].len = uVar10 - OVar18;
                  uVar30 = (ulong)(iVar14 + 1);
                }
              }
              poVar15 = local_68;
              poVar19 = local_118;
              uVar30 = local_50 + 1;
            }
            uVar11 = local_58 + 1;
          }
        }
        tile = local_c8;
      }
    }
    local_110 = local_110 + 1;
  } while( true );
}

Assistant:

OPJ_BOOL opj_t1_encode_cblks(opj_t1_t *t1,
                             opj_tcd_tile_t *tile,
                             opj_tcp_t *tcp,
                             const OPJ_FLOAT64 * mct_norms,
                             OPJ_UINT32 mct_numcomps
                            )
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno;

    tile->distotile = 0;        /* fixed_quality */

    for (compno = 0; compno < tile->numcomps; ++compno) {
        opj_tcd_tilecomp_t* tilec = &tile->comps[compno];
        opj_tccp_t* tccp = &tcp->tccps[compno];
        OPJ_UINT32 tile_w = (OPJ_UINT32)(tilec->x1 - tilec->x0);

        for (resno = 0; resno < tilec->numresolutions; ++resno) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; ++bandno) {
                opj_tcd_band_t* OPJ_RESTRICT band = &res->bands[bandno];
                OPJ_INT32 bandconst;

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                bandconst = 8192 * 8192 / ((OPJ_INT32) floor(band->stepsize * 8192));
                for (precno = 0; precno < res->pw * res->ph; ++precno) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; ++cblkno) {
                        opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
                        OPJ_INT32* OPJ_RESTRICT tiledp;
                        OPJ_UINT32 cblk_w;
                        OPJ_UINT32 cblk_h;
                        OPJ_UINT32 i, j, tileLineAdvance;
                        OPJ_SIZE_T tileIndex = 0;

                        OPJ_INT32 x = cblk->x0 - band->x0;
                        OPJ_INT32 y = cblk->y0 - band->y0;
                        if (band->bandno & 1) {
                            opj_tcd_resolution_t *pres = &tilec->resolutions[resno - 1];
                            x += pres->x1 - pres->x0;
                        }
                        if (band->bandno & 2) {
                            opj_tcd_resolution_t *pres = &tilec->resolutions[resno - 1];
                            y += pres->y1 - pres->y0;
                        }

                        if (!opj_t1_allocate_buffers(
                                    t1,
                                    (OPJ_UINT32)(cblk->x1 - cblk->x0),
                                    (OPJ_UINT32)(cblk->y1 - cblk->y0))) {
                            return OPJ_FALSE;
                        }

                        cblk_w = t1->w;
                        cblk_h = t1->h;
                        tileLineAdvance = tile_w - cblk_w;

                        tiledp = &tilec->data[(OPJ_SIZE_T)y * tile_w + (OPJ_SIZE_T)x];
                        t1->data = tiledp;
                        t1->data_stride = tile_w;
                        if (tccp->qmfbid == 1) {
                            /* Do multiplication on unsigned type, even if the
                             * underlying type is signed, to avoid potential
                             * int overflow on large value (the output will be
                             * incorrect in such situation, but whatever...)
                             * This assumes complement-to-2 signed integer
                             * representation
                             * Fixes https://github.com/uclouvain/openjpeg/issues/1053
                             */
                            OPJ_UINT32* OPJ_RESTRICT tiledp_u = (OPJ_UINT32*) tiledp;
                            for (j = 0; j < cblk_h; ++j) {
                                for (i = 0; i < cblk_w; ++i) {
                                    tiledp_u[tileIndex] <<= T1_NMSEDEC_FRACBITS;
                                    tileIndex++;
                                }
                                tileIndex += tileLineAdvance;
                            }
                        } else {        /* if (tccp->qmfbid == 0) */
                            for (j = 0; j < cblk_h; ++j) {
                                for (i = 0; i < cblk_w; ++i) {
                                    OPJ_INT32 tmp = tiledp[tileIndex];
                                    tiledp[tileIndex] =
                                        opj_int_fix_mul_t1(
                                            tmp,
                                            bandconst);
                                    tileIndex++;
                                }
                                tileIndex += tileLineAdvance;
                            }
                        }

                        opj_t1_encode_cblk(
                            t1,
                            cblk,
                            band->bandno,
                            compno,
                            tilec->numresolutions - 1 - resno,
                            tccp->qmfbid,
                            band->stepsize,
                            tccp->cblksty,
                            tile->numcomps,
                            tile,
                            mct_norms,
                            mct_numcomps);

                    } /* cblkno */
                } /* precno */
            } /* bandno */
        } /* resno  */
    } /* compno  */
    return OPJ_TRUE;
}